

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::StringToIntegerImpl<unsigned_long>
               (unsigned_long *val,char *str,int base,bool check_errno)

{
  byte bVar1;
  bool bVar2;
  int *piVar3;
  byte *pbVar4;
  char *endptr;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x11f,
                  "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = unsigned long]"
                 );
  }
LAB_0011ef50:
  pbVar4 = (byte *)(str + 1);
  if (base < 1) {
    while( true ) {
      bVar1 = pbVar4[-1];
      if (bVar1 == 0) break;
      if ((int)(char)bVar1 - 0x30U < 10) {
        if ((bVar1 == 0x30) && (base = 0x10, (*pbVar4 & 0xdf) == 0x58)) goto LAB_0011ef50;
        break;
      }
      pbVar4 = pbVar4 + 1;
    }
    base = 10;
    goto LAB_0011ef50;
  }
  if (check_errno) {
    piVar3 = __errno_location();
    *piVar3 = 0;
  }
  endptr = str;
  strtoval_impl(val,str,&endptr,base);
  if ((endptr == str) || (*endptr != '\0')) {
    *val = 0;
LAB_0011efd0:
    bVar2 = false;
  }
  else {
    if (check_errno) {
      piVar3 = __errno_location();
      if (*piVar3 != 0) goto LAB_0011efd0;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool StringToIntegerImpl(T *val, const char *const str,
                                const int base = 0,
                                const bool check_errno = true) {
  // T is int64_t or uint64_T
  FLATBUFFERS_ASSERT(str);
  if (base <= 0) {
    auto s = str;
    while (*s && !is_digit(*s)) s++;
    if (s[0] == '0' && is_alpha_char(s[1], 'X'))
      return StringToIntegerImpl(val, str, 16, check_errno);
    // if a prefix not match, try base=10
    return StringToIntegerImpl(val, str, 10, check_errno);
  } else {
    if (check_errno) errno = 0;  // clear thread-local errno
    auto endptr = str;
    strtoval_impl(val, str, const_cast<char **>(&endptr), base);
    if ((*endptr != '\0') || (endptr == str)) {
      *val = 0;      // erase partial result
      return false;  // invalid string
    }
    // errno is out-of-range, return MAX/MIN
    if (check_errno && errno) return false;
    return true;
  }
}